

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_seen_key_event(Terminal *term)

{
  beeptime *ptr;
  
  term->beep_overloaded = false;
  ptr = term->beephead;
  while (ptr != (beeptime *)0x0) {
    term->beephead = ptr->next;
    safefree(ptr);
    ptr = term->beephead;
  }
  term->beeptail = (beeptime *)0x0;
  term->nbeeps = L'\0';
  if (term->scroll_on_key == true) {
    term->disptop = L'\0';
    term->seen_disp_event = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
      return;
    }
  }
  return;
}

Assistant:

void term_seen_key_event(Terminal *term)
{
    /*
     * On any keypress, clear the bell overload mechanism
     * completely, on the grounds that large numbers of
     * beeps coming from deliberate key action are likely
     * to be intended (e.g. beeps from filename completion
     * blocking repeatedly).
     */
    term->beep_overloaded = false;
    while (term->beephead) {
        struct beeptime *tmp = term->beephead;
        term->beephead = tmp->next;
        sfree(tmp);
    }
    term->beeptail = NULL;
    term->nbeeps = 0;

    /*
     * Reset the scrollback on keypress, if we're doing that.
     */
    if (term->scroll_on_key) {
        term->disptop = 0;             /* return to main screen */
        seen_disp_event(term);
    }
}